

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

int pbrt::rply_vertex_callback(p_ply_argument argument)

{
  p_ply_argument in_RDI;
  double dVar1;
  int offset;
  int stride;
  long flags;
  long index;
  Float *buffer;
  ulong local_20;
  long local_18;
  void *local_10;
  p_ply_argument local_8;
  
  local_8 = in_RDI;
  ply_get_argument_user_data(in_RDI,&local_10,(long *)&local_20);
  ply_get_argument_element(local_8,(p_ply_element *)0x0,&local_18);
  dVar1 = ply_get_argument_value(local_8);
  *(float *)((long)local_10 +
            (local_18 * (int)((long)(local_20 & 0xf0) >> 4) + (long)(int)((uint)local_20 & 0xf)) * 4
            ) = (float)dVar1;
  return 1;
}

Assistant:

int rply_vertex_callback(p_ply_argument argument) {
    Float *buffer;
    long index, flags;

    ply_get_argument_user_data(argument, (void **)&buffer, &flags);
    ply_get_argument_element(argument, nullptr, &index);

    int stride = (flags & 0x0F0) >> 4;
    int offset = flags & 0x00F;

    buffer[index * stride + offset] = (float)ply_get_argument_value(argument);

    return 1;
}